

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_FullRHS(void *arkode_mem,realtype t,N_Vector y,N_Vector f,int mode)

{
  MRIStepInnerStepper p_Var1;
  MRIStepInnerFullRhsFn p_Var2;
  int iVar3;
  N_Vector *pp_Var4;
  ARKodeMem ark_mem_00;
  N_Vector x;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  ARKodeMem local_38;
  ARKodeMRIStepMem local_30;
  
  iVar3 = mriStep_AccessStepMem(arkode_mem,"mriStep_FullRHS",&local_38,&local_30);
  ark_mem_00 = local_38;
  if (iVar3 != 0) {
    return iVar3;
  }
  if (mode == 2) {
    if (local_30->explicit_rhs != 0) {
      iVar3 = (*local_30->fse)(t,y,local_38->tempv2,local_38->user_data);
      local_30->nfse = local_30->nfse + 1;
      if (iVar3 != 0) goto LAB_00411b1e;
    }
    ark_mem_00 = local_38;
    if (local_30->implicit_rhs != 0) {
      iVar3 = (*local_30->fsi)(t,y,local_30->sdata,local_38->user_data);
      local_30->nfsi = local_30->nfsi + 1;
      if (iVar3 != 0) goto LAB_00411b1e;
    }
    p_Var1 = local_30->stepper;
    ark_mem_00 = local_38;
    if (((p_Var1 == (MRIStepInnerStepper)0x0) || (p_Var1->ops == (MRIStepInnerStepper_Ops)0x0)) ||
       (p_Var2 = p_Var1->ops->fullrhs, p_Var2 == (MRIStepInnerFullRhsFn)0x0)) goto LAB_00411b1e;
    iVar3 = (*p_Var2)(p_Var1,t,y,f,2);
    p_Var1->last_flag = iVar3;
    ark_mem_00 = local_38;
    if (iVar3 != 0) goto LAB_00411b1e;
    if ((local_30->explicit_rhs == 0) || (local_30->implicit_rhs == 0)) {
      if (local_30->implicit_rhs == 0) {
        x = local_38->tempv2;
        goto LAB_00411b93;
      }
    }
    else {
      N_VLinearSum(1.0,local_38->tempv2,1.0,f,f);
    }
    x = local_30->sdata;
    goto LAB_00411b93;
  }
  if ((mode != 1) && (mode != 0)) {
    arkProcessError(local_38,-8,"ARKode::MRIStep","mriStep_FullRHS","Unknown full RHS mode",t);
    return -8;
  }
  if (local_30->explicit_rhs != 0) {
    iVar3 = (*local_30->fse)(t,y,*local_30->Fse,local_38->user_data);
    local_30->nfse = local_30->nfse + 1;
    if (iVar3 != 0) goto LAB_00411b1e;
  }
  ark_mem_00 = local_38;
  if (local_30->implicit_rhs != 0) {
    iVar3 = (*local_30->fsi)(t,y,*local_30->Fsi,local_38->user_data);
    local_30->nfsi = local_30->nfsi + 1;
    if (iVar3 != 0) goto LAB_00411b1e;
  }
  p_Var1 = local_30->stepper;
  ark_mem_00 = local_38;
  if (((p_Var1 == (MRIStepInnerStepper)0x0) || (p_Var1->ops == (MRIStepInnerStepper_Ops)0x0)) ||
     (p_Var2 = p_Var1->ops->fullrhs, p_Var2 == (MRIStepInnerFullRhsFn)0x0)) {
LAB_00411b1e:
    arkProcessError(ark_mem_00,-8,"ARKode::MRIStep","mriStep_FullRHS",
                    "At t = %lg, the right-hand side routine failed in an unrecoverable manner.",t);
    return -8;
  }
  iVar3 = (*p_Var2)(p_Var1,t,y,f,2);
  p_Var1->last_flag = iVar3;
  ark_mem_00 = local_38;
  if (iVar3 != 0) goto LAB_00411b1e;
  if ((local_30->explicit_rhs == 0) || (local_30->implicit_rhs == 0)) {
    if (local_30->implicit_rhs != 0) goto LAB_00411b41;
    pp_Var4 = local_30->Fse;
  }
  else {
    N_VLinearSum(1.0,*local_30->Fse,1.0,f,f);
LAB_00411b41:
    pp_Var4 = local_30->Fsi;
  }
  x = *pp_Var4;
LAB_00411b93:
  N_VLinearSum(1.0,x,1.0,f,f);
  return 0;
}

Assistant:

int mriStep_FullRHS(void* arkode_mem, realtype t, N_Vector y, N_Vector f,
                    int mode)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_FullRHS",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* perform RHS functions contingent on 'mode' argument */
  switch(mode) {

  /* ARK_FULLRHS_START: called at the beginning of a simulation
     Store the vector fs(t,y) in F[0] for possible reuse
     in the first stage of the subsequent time step */
  case ARK_FULLRHS_START:

    /* call fse if the problem has an explicit component */
    if (step_mem->explicit_rhs) {
      retval = step_mem->fse(t, y, step_mem->Fse[0], ark_mem->user_data);
      step_mem->nfse++;
      if (retval != 0) {
         arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                         "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
         return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call fsi if the problem has an implicit component */
    if (step_mem->implicit_rhs) {
      retval = step_mem->fsi(t, y, step_mem->Fsi[0], ark_mem->user_data);
      step_mem->nfsi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call ff (force new RHS computation) */
    retval = mriStepInnerStepper_FullRhs(step_mem->stepper, t, y, f,
                                         ARK_FULLRHS_OTHER);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                      "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    /* combine RHS vectors into output */
    if (step_mem->explicit_rhs && step_mem->implicit_rhs) { /* ImEx */
      N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
    } else {
      if (step_mem->implicit_rhs) {         /* implicit */
        N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
      } else {                          /* explicit */
        N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      }
    }

    break;


  /* ARK_FULLRHS_END: called at the end of a successful step
     This always recomputes the full RHS (i.e., this is the
     same as case 0). */
  case ARK_FULLRHS_END:

    /* call fse if the problem has an explicit component */
    if (step_mem->explicit_rhs) {
      retval = step_mem->fse(t, y, step_mem->Fse[0], ark_mem->user_data);
      step_mem->nfse++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call fsi if the problem has an implicit component */
    if (step_mem->implicit_rhs) {
      retval = step_mem->fsi(t, y, step_mem->Fsi[0], ark_mem->user_data);
      step_mem->nfsi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call ff (force new RHS computation) */
    retval = mriStepInnerStepper_FullRhs(step_mem->stepper, t, y, f,
                                         ARK_FULLRHS_OTHER);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                      "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    /* combine RHS vectors into output */
    if (step_mem->explicit_rhs && step_mem->implicit_rhs) { /* ImEx */
      N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
    } else {
      if (step_mem->implicit_rhs) {         /* implicit */
        N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
      } else {                          /* explicit */
        N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      }
    }
    break;

  /*  ARK_FULLRHS_OTHER: called for dense output in-between steps
      store the intermediate calculations in such a way as to not
      interfere with the other two modes */
  case ARK_FULLRHS_OTHER:

    /* call fse if the problem has an explicit component (store in ark_tempv2) */
    if (step_mem->explicit_rhs) {
      retval = step_mem->fse(t, y, ark_mem->tempv2, ark_mem->user_data);
      step_mem->nfse++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call fsi if the problem has an implicit component (store in sdata) */
    if (step_mem->implicit_rhs) {
      retval = step_mem->fsi(t, y, step_mem->sdata, ark_mem->user_data);
      step_mem->nfsi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }


    /* call ff (force new RHS computation) */
    retval = mriStepInnerStepper_FullRhs(step_mem->stepper, t, y, f,
                                         ARK_FULLRHS_OTHER);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                      "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    /* combine RHS vectors into output */
    if (step_mem->explicit_rhs && step_mem->implicit_rhs) { /* ImEx */
      N_VLinearSum(ONE, ark_mem->tempv2, ONE, f, f);
      N_VLinearSum(ONE, step_mem->sdata, ONE, f, f);
    } else {                   /* implicit */
      if (step_mem->implicit_rhs) {
        N_VLinearSum(ONE, step_mem->sdata, ONE, f, f);
      } else {                                           /* explicit */
        N_VLinearSum(ONE, ark_mem->tempv2, ONE, f, f);
      }
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                    "mriStep_FullRHS", "Unknown full RHS mode");
    return(ARK_RHSFUNC_FAIL);
  }

  return(ARK_SUCCESS);
}